

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

void __thiscall capnp::_::OrphanBuilder::truncateText(OrphanBuilder *this,ElementCount size)

{
  int iVar1;
  undefined4 in_register_00000034;
  OrphanBuilder local_30;
  
  iVar1 = truncate(this,(char *)CONCAT44(in_register_00000034,size),1);
  if ((char)iVar1 == '\0') {
    initText(&local_30,(BuilderArena *)(this->segment->super_SegmentReader).arena,this->capTable,
             size);
    if (this->segment != (SegmentBuilder *)0x0) {
      euthanize(this);
    }
    this->segment = local_30.segment;
    this->capTable = local_30.capTable;
    this->location = local_30.location;
    (this->tag).content = local_30.tag.content;
  }
  return;
}

Assistant:

void OrphanBuilder::truncateText(ElementCount size) {
  if (!truncate(size, true)) {
    // assumeBits() safe since it's checked inside truncate()
    *this = initText(segment->getArena(), capTable,
        assumeBits<LIST_ELEMENT_COUNT_BITS>(size) * (ONE * BYTES / ELEMENTS));
  }
}